

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding.cpp
# Opt level: O1

void ncnn::copy_make_border_image<unsigned_short>
               (Mat *src,Mat *dst,int top,int left,int type,unsigned_short v)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined2 *puVar17;
  int iVar18;
  long lVar19;
  void *pvVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  undefined2 *puVar25;
  undefined1 auVar26 [16];
  int iVar29;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  int iVar36;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar49 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  int iVar72;
  int iVar73;
  int iVar78;
  undefined1 auVar74 [16];
  int iVar79;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 in_XMM15 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  long local_78;
  
  auVar55 = _DAT_005ff2c0;
  auVar53 = _DAT_005f2a10;
  auVar39 = _DAT_005ef050;
  auVar52 = _DAT_005ef040;
  uVar21 = (ulong)(uint)left;
  uVar1 = dst->w;
  lVar24 = (long)(int)uVar1;
  iVar2 = dst->h;
  puVar17 = (undefined2 *)src->data;
  pvVar20 = dst->data;
  if (type == 0) {
    if (top < 1) {
      auVar39 = in_XMM5;
      iVar73 = 0;
    }
    else {
      lVar23 = (ulong)uVar1 - 1;
      auVar26._8_4_ = (int)lVar23;
      auVar26._0_8_ = lVar23;
      auVar26._12_4_ = (int)((ulong)lVar23 >> 0x20);
      iVar18 = 0;
      auVar26 = auVar26 ^ _DAT_005ef050;
      in_XMM6._8_4_ = 0xffffffff;
      in_XMM6._0_8_ = 0xffffffffffffffff;
      in_XMM6._12_4_ = 0xffffffff;
      do {
        if (0 < (int)uVar1) {
          lVar23 = 0;
          auVar81 = auVar52;
          auVar37 = auVar53;
          auVar49 = auVar55;
          auVar50 = _DAT_005ff2b0;
          do {
            auVar59 = auVar81 ^ auVar39;
            iVar73 = auVar26._0_4_;
            iVar72 = -(uint)(iVar73 < auVar59._0_4_);
            iVar36 = auVar26._4_4_;
            auVar60._4_4_ = -(uint)(iVar36 < auVar59._4_4_);
            iVar79 = auVar26._8_4_;
            iVar78 = -(uint)(iVar79 < auVar59._8_4_);
            iVar29 = auVar26._12_4_;
            auVar60._12_4_ = -(uint)(iVar29 < auVar59._12_4_);
            auVar30._4_4_ = iVar72;
            auVar30._0_4_ = iVar72;
            auVar30._8_4_ = iVar78;
            auVar30._12_4_ = iVar78;
            auVar80 = pshuflw(in_XMM15,auVar30,0xe8);
            auVar31._4_4_ = -(uint)(auVar59._4_4_ == iVar36);
            auVar31._12_4_ = -(uint)(auVar59._12_4_ == iVar29);
            auVar31._0_4_ = auVar31._4_4_;
            auVar31._8_4_ = auVar31._12_4_;
            auVar30 = pshuflw(in_XMM1,auVar31,0xe8);
            auVar60._0_4_ = auVar60._4_4_;
            auVar60._8_4_ = auVar60._12_4_;
            auVar59 = pshuflw(auVar80,auVar60,0xe8);
            auVar30 = (auVar59 | auVar30 & auVar80) ^ in_XMM6;
            auVar30 = packssdw(auVar30,auVar30);
            if ((auVar30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(unsigned_short *)((long)pvVar20 + lVar23) = v;
            }
            auVar59._4_4_ = iVar72;
            auVar59._0_4_ = iVar72;
            auVar59._8_4_ = iVar78;
            auVar59._12_4_ = iVar78;
            auVar60 = auVar31 & auVar59 | auVar60;
            auVar59 = packssdw(auVar60,auVar60);
            auVar59 = packssdw(auVar59 ^ in_XMM6,auVar59 ^ in_XMM6);
            if ((auVar59._0_4_ >> 0x10 & 1) != 0) {
              *(unsigned_short *)((long)pvVar20 + lVar23 + 2) = v;
            }
            auVar59 = auVar37 ^ auVar39;
            iVar72 = -(uint)(iVar73 < auVar59._0_4_);
            auVar74._4_4_ = -(uint)(iVar36 < auVar59._4_4_);
            iVar78 = -(uint)(iVar79 < auVar59._8_4_);
            auVar74._12_4_ = -(uint)(iVar29 < auVar59._12_4_);
            auVar61._4_4_ = iVar72;
            auVar61._0_4_ = iVar72;
            auVar61._8_4_ = iVar78;
            auVar61._12_4_ = iVar78;
            iVar72 = -(uint)(auVar59._4_4_ == iVar36);
            iVar78 = -(uint)(auVar59._12_4_ == iVar29);
            auVar80._4_4_ = iVar72;
            auVar80._0_4_ = iVar72;
            auVar80._8_4_ = iVar78;
            auVar80._12_4_ = iVar78;
            auVar74._0_4_ = auVar74._4_4_;
            auVar74._8_4_ = auVar74._12_4_;
            auVar59 = auVar80 & auVar61 | auVar74;
            auVar59 = packssdw(auVar59,auVar59);
            auVar59 = packssdw(auVar59 ^ in_XMM6,auVar59 ^ in_XMM6);
            if ((auVar59 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(unsigned_short *)((long)pvVar20 + lVar23 + 4) = v;
            }
            auVar59 = pshufhw(auVar59,auVar61,0x84);
            auVar4._4_4_ = iVar72;
            auVar4._0_4_ = iVar72;
            auVar4._8_4_ = iVar78;
            auVar4._12_4_ = iVar78;
            auVar60 = pshufhw(auVar61,auVar4,0x84);
            auVar31 = pshufhw(auVar59,auVar74,0x84);
            auVar59 = (auVar31 | auVar60 & auVar59) ^ in_XMM6;
            auVar59 = packssdw(auVar59,auVar59);
            if ((auVar59 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(unsigned_short *)((long)pvVar20 + lVar23 + 6) = v;
            }
            auVar59 = auVar49 ^ auVar39;
            iVar72 = -(uint)(iVar73 < auVar59._0_4_);
            auVar63._4_4_ = -(uint)(iVar36 < auVar59._4_4_);
            iVar78 = -(uint)(iVar79 < auVar59._8_4_);
            auVar63._12_4_ = -(uint)(iVar29 < auVar59._12_4_);
            auVar5._4_4_ = iVar72;
            auVar5._0_4_ = iVar72;
            auVar5._8_4_ = iVar78;
            auVar5._12_4_ = iVar78;
            auVar31 = pshuflw(auVar30,auVar5,0xe8);
            auVar32._0_4_ = -(uint)(auVar59._0_4_ == iVar73);
            auVar32._4_4_ = -(uint)(auVar59._4_4_ == iVar36);
            auVar32._8_4_ = -(uint)(auVar59._8_4_ == iVar79);
            auVar32._12_4_ = -(uint)(auVar59._12_4_ == iVar29);
            auVar62._4_4_ = auVar32._4_4_;
            auVar62._0_4_ = auVar32._4_4_;
            auVar62._8_4_ = auVar32._12_4_;
            auVar62._12_4_ = auVar32._12_4_;
            auVar30 = pshuflw(auVar32,auVar62,0xe8);
            auVar63._0_4_ = auVar63._4_4_;
            auVar63._8_4_ = auVar63._12_4_;
            auVar59 = pshuflw(auVar31,auVar63,0xe8);
            in_XMM15 = (auVar59 | auVar30 & auVar31) ^ in_XMM6;
            auVar30 = packssdw(auVar30 & auVar31,in_XMM15);
            if ((auVar30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(unsigned_short *)((long)pvVar20 + lVar23 + 8) = v;
            }
            auVar6._4_4_ = iVar72;
            auVar6._0_4_ = iVar72;
            auVar6._8_4_ = iVar78;
            auVar6._12_4_ = iVar78;
            auVar63 = auVar62 & auVar6 | auVar63;
            auVar59 = packssdw(auVar63,auVar63);
            auVar30 = packssdw(auVar30,auVar59 ^ in_XMM6);
            if ((auVar30 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(unsigned_short *)((long)pvVar20 + lVar23 + 10) = v;
            }
            auVar30 = auVar50 ^ auVar39;
            iVar73 = -(uint)(iVar73 < auVar30._0_4_);
            auVar75._4_4_ = -(uint)(iVar36 < auVar30._4_4_);
            iVar79 = -(uint)(iVar79 < auVar30._8_4_);
            auVar75._12_4_ = -(uint)(iVar29 < auVar30._12_4_);
            auVar64._4_4_ = iVar73;
            auVar64._0_4_ = iVar73;
            auVar64._8_4_ = iVar79;
            auVar64._12_4_ = iVar79;
            iVar73 = -(uint)(auVar30._4_4_ == iVar36);
            iVar36 = -(uint)(auVar30._12_4_ == iVar29);
            auVar7._4_4_ = iVar73;
            auVar7._0_4_ = iVar73;
            auVar7._8_4_ = iVar36;
            auVar7._12_4_ = iVar36;
            auVar75._0_4_ = auVar75._4_4_;
            auVar75._8_4_ = auVar75._12_4_;
            auVar30 = auVar7 & auVar64 | auVar75;
            auVar30 = packssdw(auVar30,auVar30);
            auVar30 = packssdw(auVar30 ^ in_XMM6,auVar30 ^ in_XMM6);
            if ((auVar30 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(unsigned_short *)((long)pvVar20 + lVar23 + 0xc) = v;
            }
            auVar30 = pshufhw(auVar30,auVar64,0x84);
            auVar8._4_4_ = iVar73;
            auVar8._0_4_ = iVar73;
            auVar8._8_4_ = iVar36;
            auVar8._12_4_ = iVar36;
            auVar31 = pshufhw(auVar64,auVar8,0x84);
            auVar59 = pshufhw(auVar30,auVar75,0x84);
            auVar30 = (auVar59 | auVar31 & auVar30) ^ in_XMM6;
            in_XMM1 = packssdw(auVar30,auVar30);
            if ((in_XMM1 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(unsigned_short *)((long)pvVar20 + lVar23 + 0xe) = v;
            }
            lVar19 = auVar81._8_8_;
            auVar81._0_8_ = auVar81._0_8_ + 8;
            auVar81._8_8_ = lVar19 + 8;
            lVar19 = auVar37._8_8_;
            auVar37._0_8_ = auVar37._0_8_ + 8;
            auVar37._8_8_ = lVar19 + 8;
            lVar19 = auVar49._8_8_;
            auVar49._0_8_ = auVar49._0_8_ + 8;
            auVar49._8_8_ = lVar19 + 8;
            lVar19 = auVar50._8_8_;
            auVar50._0_8_ = auVar50._0_8_ + 8;
            auVar50._8_8_ = lVar19 + 8;
            lVar23 = lVar23 + 0x10;
          } while ((ulong)(uVar1 + 7 >> 3) << 4 != lVar23);
        }
        pvVar20 = (void *)((long)pvVar20 + lVar24 * 2);
        iVar18 = iVar18 + 1;
        iVar73 = top;
      } while (iVar18 != top);
    }
    if (iVar73 < src->h + top) {
      local_78 = (long)pvVar20 + 0xe;
      auVar65._8_4_ = 0xffffffff;
      auVar65._0_8_ = 0xffffffffffffffff;
      auVar65._12_4_ = 0xffffffff;
      auVar52 = _DAT_005ff2b0;
      auVar53 = _DAT_005ff2c0;
      auVar55 = _DAT_005f2a10;
      auVar26 = _DAT_005ef040;
      auVar81 = _DAT_005ef050;
      do {
        uVar22 = 0;
        if (0 < left) {
          uVar22 = 0;
          do {
            *(unsigned_short *)((long)pvVar20 + uVar22 * 2) = v;
            uVar22 = uVar22 + 1;
          } while ((uint)left != uVar22);
        }
        uVar3 = src->w;
        if ((int)uVar3 < 0xc) {
          if ((int)uVar22 < (int)(uVar3 + left)) {
            uVar22 = uVar22 & 0xffffffff;
            do {
              *(undefined2 *)((long)pvVar20 + uVar22 * 2) = puVar17[uVar22 - (long)left];
              uVar22 = uVar22 + 1;
            } while (uVar3 + left != uVar22);
          }
        }
        else {
          memcpy((void *)((long)pvVar20 + (long)left * 2),puVar17,(ulong)uVar3 * 2);
          auVar65._8_4_ = 0xffffffff;
          auVar65._0_8_ = 0xffffffffffffffff;
          auVar65._12_4_ = 0xffffffff;
          uVar22 = (ulong)(uint)((int)uVar22 + src->w);
          auVar52 = _DAT_005ff2b0;
          auVar53 = _DAT_005ff2c0;
          auVar55 = _DAT_005f2a10;
          auVar26 = _DAT_005ef040;
          auVar81 = _DAT_005ef050;
        }
        iVar18 = (int)uVar22;
        if (iVar18 < (int)uVar1) {
          lVar19 = lVar24 - iVar18;
          lVar23 = lVar19 + -1;
          auVar27._8_4_ = (int)lVar23;
          auVar27._0_8_ = lVar23;
          auVar27._12_4_ = (int)((ulong)lVar23 >> 0x20);
          lVar23 = local_78 + (long)iVar18 * 2;
          auVar27 = auVar27 ^ auVar81;
          uVar22 = 0;
          do {
            auVar33._8_4_ = (int)uVar22;
            auVar33._0_8_ = uVar22;
            auVar33._12_4_ = (int)(uVar22 >> 0x20);
            auVar37 = (auVar33 | auVar26) ^ auVar81;
            iVar18 = auVar27._0_4_;
            iVar72 = -(uint)(iVar18 < auVar37._0_4_);
            iVar36 = auVar27._4_4_;
            auVar38._4_4_ = -(uint)(iVar36 < auVar37._4_4_);
            iVar79 = auVar27._8_4_;
            iVar78 = -(uint)(iVar79 < auVar37._8_4_);
            iVar29 = auVar27._12_4_;
            auVar38._12_4_ = -(uint)(iVar29 < auVar37._12_4_);
            auVar44._4_4_ = iVar72;
            auVar44._0_4_ = iVar72;
            auVar44._8_4_ = iVar78;
            auVar44._12_4_ = iVar78;
            auVar49 = pshuflw(auVar39,auVar44,0xe8);
            auVar39._4_4_ = -(uint)(auVar37._4_4_ == iVar36);
            auVar39._12_4_ = -(uint)(auVar37._12_4_ == iVar29);
            auVar39._0_4_ = auVar39._4_4_;
            auVar39._8_4_ = auVar39._12_4_;
            auVar50 = pshuflw(in_XMM6,auVar39,0xe8);
            auVar38._0_4_ = auVar38._4_4_;
            auVar38._8_4_ = auVar38._12_4_;
            auVar37 = pshuflw(auVar49,auVar38,0xe8);
            auVar37 = (auVar37 | auVar50 & auVar49) ^ auVar65;
            auVar37 = packssdw(auVar37,auVar37);
            if ((auVar37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(unsigned_short *)(lVar23 + -0xe + uVar22 * 2) = v;
            }
            auVar38 = auVar39 & auVar44 | auVar38;
            auVar39 = packssdw(auVar38,auVar38);
            auVar39 = packssdw(auVar39 ^ auVar65,auVar39 ^ auVar65);
            if ((auVar39._0_4_ >> 0x10 & 1) != 0) {
              *(unsigned_short *)(lVar23 + -0xc + uVar22 * 2) = v;
            }
            auVar39 = (auVar33 | auVar55) ^ auVar81;
            iVar72 = -(uint)(iVar18 < auVar39._0_4_);
            auVar48._4_4_ = -(uint)(iVar36 < auVar39._4_4_);
            iVar78 = -(uint)(iVar79 < auVar39._8_4_);
            auVar48._12_4_ = -(uint)(iVar29 < auVar39._12_4_);
            auVar40._4_4_ = iVar72;
            auVar40._0_4_ = iVar72;
            auVar40._8_4_ = iVar78;
            auVar40._12_4_ = iVar78;
            auVar45._4_4_ = -(uint)(auVar39._4_4_ == iVar36);
            auVar45._12_4_ = -(uint)(auVar39._12_4_ == iVar29);
            auVar45._0_4_ = auVar45._4_4_;
            auVar45._8_4_ = auVar45._12_4_;
            auVar48._0_4_ = auVar48._4_4_;
            auVar48._8_4_ = auVar48._12_4_;
            auVar39 = auVar45 & auVar40 | auVar48;
            auVar39 = packssdw(auVar39,auVar39);
            auVar39 = packssdw(auVar39 ^ auVar65,auVar39 ^ auVar65);
            if ((auVar39 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(unsigned_short *)(lVar23 + -10 + uVar22 * 2) = v;
            }
            auVar37 = pshufhw(auVar40,auVar40,0x84);
            auVar59 = pshufhw(auVar45,auVar45,0x84);
            auVar30 = pshufhw(auVar37,auVar48,0x84);
            auVar37 = (auVar30 | auVar59 & auVar37) ^ auVar65;
            auVar37 = packssdw(auVar37,auVar37);
            if ((auVar37 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(unsigned_short *)(lVar23 + -8 + uVar22 * 2) = v;
            }
            auVar37 = (auVar33 | auVar53) ^ auVar81;
            iVar72 = -(uint)(iVar18 < auVar37._0_4_);
            auVar42._4_4_ = -(uint)(iVar36 < auVar37._4_4_);
            iVar78 = -(uint)(iVar79 < auVar37._8_4_);
            auVar42._12_4_ = -(uint)(iVar29 < auVar37._12_4_);
            auVar46._4_4_ = iVar72;
            auVar46._0_4_ = iVar72;
            auVar46._8_4_ = iVar78;
            auVar46._12_4_ = iVar78;
            auVar39 = pshuflw(auVar39,auVar46,0xe8);
            auVar41._4_4_ = -(uint)(auVar37._4_4_ == iVar36);
            auVar41._12_4_ = -(uint)(auVar37._12_4_ == iVar29);
            auVar41._0_4_ = auVar41._4_4_;
            auVar41._8_4_ = auVar41._12_4_;
            auVar37 = pshuflw(auVar50 & auVar49,auVar41,0xe8);
            in_XMM6 = auVar37 & auVar39;
            auVar42._0_4_ = auVar42._4_4_;
            auVar42._8_4_ = auVar42._12_4_;
            auVar39 = pshuflw(auVar39,auVar42,0xe8);
            auVar39 = (auVar39 | in_XMM6) ^ auVar65;
            auVar39 = packssdw(auVar39,auVar39);
            if ((auVar39 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(unsigned_short *)(lVar23 + -6 + uVar22 * 2) = v;
            }
            auVar42 = auVar41 & auVar46 | auVar42;
            auVar37 = packssdw(auVar42,auVar42);
            auVar37 = packssdw(auVar37 ^ auVar65,auVar37 ^ auVar65);
            if ((auVar37 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(unsigned_short *)(lVar23 + -4 + uVar22 * 2) = v;
            }
            auVar37 = (auVar33 | auVar52) ^ auVar81;
            iVar18 = -(uint)(iVar18 < auVar37._0_4_);
            auVar47._4_4_ = -(uint)(iVar36 < auVar37._4_4_);
            iVar79 = -(uint)(iVar79 < auVar37._8_4_);
            auVar47._12_4_ = -(uint)(iVar29 < auVar37._12_4_);
            auVar43._4_4_ = iVar18;
            auVar43._0_4_ = iVar18;
            auVar43._8_4_ = iVar79;
            auVar43._12_4_ = iVar79;
            auVar34._4_4_ = -(uint)(auVar37._4_4_ == iVar36);
            auVar34._12_4_ = -(uint)(auVar37._12_4_ == iVar29);
            auVar34._0_4_ = auVar34._4_4_;
            auVar34._8_4_ = auVar34._12_4_;
            auVar47._0_4_ = auVar47._4_4_;
            auVar47._8_4_ = auVar47._12_4_;
            auVar37 = auVar34 & auVar43 | auVar47;
            auVar37 = packssdw(auVar37,auVar37);
            auVar37 = packssdw(auVar37 ^ auVar65,auVar37 ^ auVar65);
            if ((auVar37 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(unsigned_short *)(lVar23 + -2 + uVar22 * 2) = v;
            }
            auVar49 = pshufhw(auVar43,auVar43,0x84);
            auVar37 = pshufhw(auVar34,auVar34,0x84);
            auVar50 = pshufhw(auVar49,auVar47,0x84);
            in_XMM1 = packssdw(auVar37 & auVar49,(auVar50 | auVar37 & auVar49) ^ auVar65);
            if ((in_XMM1 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(unsigned_short *)(lVar23 + uVar22 * 2) = v;
            }
            uVar22 = uVar22 + 8;
          } while ((lVar19 + 7U & 0xfffffffffffffff8) != uVar22);
        }
        puVar17 = puVar17 + src->w;
        pvVar20 = (void *)((long)pvVar20 + lVar24 * 2);
        iVar73 = iVar73 + 1;
        local_78 = local_78 + lVar24 * 2;
      } while (iVar73 < src->h + top);
    }
    auVar55 = _DAT_005ff2c0;
    auVar53 = _DAT_005f2a10;
    auVar39 = _DAT_005ef050;
    auVar52 = _DAT_005ef040;
    if (iVar73 < iVar2) {
      lVar23 = (ulong)uVar1 - 1;
      auVar28._8_4_ = (int)lVar23;
      auVar28._0_8_ = lVar23;
      auVar28._12_4_ = (int)((ulong)lVar23 >> 0x20);
      auVar28 = auVar28 ^ _DAT_005ef050;
      auVar51._8_4_ = 0xffffffff;
      auVar51._0_8_ = 0xffffffffffffffff;
      auVar51._12_4_ = 0xffffffff;
      do {
        if (0 < (int)uVar1) {
          lVar23 = 0;
          auVar54 = auVar52;
          auVar56 = auVar53;
          auVar57 = auVar55;
          auVar58 = _DAT_005ff2b0;
          do {
            auVar26 = auVar54 ^ auVar39;
            iVar18 = auVar28._0_4_;
            iVar72 = -(uint)(iVar18 < auVar26._0_4_);
            iVar36 = auVar28._4_4_;
            auVar67._4_4_ = -(uint)(iVar36 < auVar26._4_4_);
            iVar79 = auVar28._8_4_;
            iVar78 = -(uint)(iVar79 < auVar26._8_4_);
            iVar29 = auVar28._12_4_;
            auVar67._12_4_ = -(uint)(iVar29 < auVar26._12_4_);
            auVar9._4_4_ = iVar72;
            auVar9._0_4_ = iVar72;
            auVar9._8_4_ = iVar78;
            auVar9._12_4_ = iVar78;
            auVar81 = pshuflw(in_XMM15,auVar9,0xe8);
            auVar66._4_4_ = -(uint)(auVar26._4_4_ == iVar36);
            auVar66._12_4_ = -(uint)(auVar26._12_4_ == iVar29);
            auVar66._0_4_ = auVar66._4_4_;
            auVar66._8_4_ = auVar66._12_4_;
            auVar26 = pshuflw(in_XMM1,auVar66,0xe8);
            auVar67._0_4_ = auVar67._4_4_;
            auVar67._8_4_ = auVar67._12_4_;
            auVar37 = pshuflw(auVar81,auVar67,0xe8);
            auVar26 = (auVar37 | auVar26 & auVar81) ^ auVar51;
            auVar26 = packssdw(auVar26,auVar26);
            if ((auVar26 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(unsigned_short *)((long)pvVar20 + lVar23) = v;
            }
            auVar10._4_4_ = iVar72;
            auVar10._0_4_ = iVar72;
            auVar10._8_4_ = iVar78;
            auVar10._12_4_ = iVar78;
            auVar67 = auVar66 & auVar10 | auVar67;
            auVar81 = packssdw(auVar67,auVar67);
            auVar81 = packssdw(auVar81 ^ auVar51,auVar81 ^ auVar51);
            if ((auVar81._0_4_ >> 0x10 & 1) != 0) {
              *(unsigned_short *)((long)pvVar20 + lVar23 + 2) = v;
            }
            auVar81 = auVar56 ^ auVar39;
            iVar72 = -(uint)(iVar18 < auVar81._0_4_);
            auVar76._4_4_ = -(uint)(iVar36 < auVar81._4_4_);
            iVar78 = -(uint)(iVar79 < auVar81._8_4_);
            auVar76._12_4_ = -(uint)(iVar29 < auVar81._12_4_);
            auVar68._4_4_ = iVar72;
            auVar68._0_4_ = iVar72;
            auVar68._8_4_ = iVar78;
            auVar68._12_4_ = iVar78;
            iVar72 = -(uint)(auVar81._4_4_ == iVar36);
            iVar78 = -(uint)(auVar81._12_4_ == iVar29);
            auVar11._4_4_ = iVar72;
            auVar11._0_4_ = iVar72;
            auVar11._8_4_ = iVar78;
            auVar11._12_4_ = iVar78;
            auVar76._0_4_ = auVar76._4_4_;
            auVar76._8_4_ = auVar76._12_4_;
            auVar81 = auVar11 & auVar68 | auVar76;
            auVar81 = packssdw(auVar81,auVar81);
            auVar81 = packssdw(auVar81 ^ auVar51,auVar81 ^ auVar51);
            if ((auVar81 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(unsigned_short *)((long)pvVar20 + lVar23 + 4) = v;
            }
            auVar81 = pshufhw(auVar81,auVar68,0x84);
            auVar12._4_4_ = iVar72;
            auVar12._0_4_ = iVar72;
            auVar12._8_4_ = iVar78;
            auVar12._12_4_ = iVar78;
            auVar49 = pshufhw(auVar68,auVar12,0x84);
            auVar37 = pshufhw(auVar81,auVar76,0x84);
            auVar81 = (auVar37 | auVar49 & auVar81) ^ auVar51;
            auVar81 = packssdw(auVar81,auVar81);
            if ((auVar81 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(unsigned_short *)((long)pvVar20 + lVar23 + 6) = v;
            }
            auVar81 = auVar57 ^ auVar39;
            iVar72 = -(uint)(iVar18 < auVar81._0_4_);
            auVar70._4_4_ = -(uint)(iVar36 < auVar81._4_4_);
            iVar78 = -(uint)(iVar79 < auVar81._8_4_);
            auVar70._12_4_ = -(uint)(iVar29 < auVar81._12_4_);
            auVar13._4_4_ = iVar72;
            auVar13._0_4_ = iVar72;
            auVar13._8_4_ = iVar78;
            auVar13._12_4_ = iVar78;
            auVar37 = pshuflw(auVar26,auVar13,0xe8);
            auVar35._0_4_ = -(uint)(auVar81._0_4_ == iVar18);
            auVar35._4_4_ = -(uint)(auVar81._4_4_ == iVar36);
            auVar35._8_4_ = -(uint)(auVar81._8_4_ == iVar79);
            auVar35._12_4_ = -(uint)(auVar81._12_4_ == iVar29);
            auVar69._4_4_ = auVar35._4_4_;
            auVar69._0_4_ = auVar35._4_4_;
            auVar69._8_4_ = auVar35._12_4_;
            auVar69._12_4_ = auVar35._12_4_;
            auVar26 = pshuflw(auVar35,auVar69,0xe8);
            auVar70._0_4_ = auVar70._4_4_;
            auVar70._8_4_ = auVar70._12_4_;
            auVar81 = pshuflw(auVar37,auVar70,0xe8);
            in_XMM15 = (auVar81 | auVar26 & auVar37) ^ auVar51;
            auVar26 = packssdw(auVar26 & auVar37,in_XMM15);
            if ((auVar26 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(unsigned_short *)((long)pvVar20 + lVar23 + 8) = v;
            }
            auVar14._4_4_ = iVar72;
            auVar14._0_4_ = iVar72;
            auVar14._8_4_ = iVar78;
            auVar14._12_4_ = iVar78;
            auVar70 = auVar69 & auVar14 | auVar70;
            auVar81 = packssdw(auVar70,auVar70);
            auVar26 = packssdw(auVar26,auVar81 ^ auVar51);
            if ((auVar26 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(unsigned_short *)((long)pvVar20 + lVar23 + 10) = v;
            }
            auVar26 = auVar58 ^ auVar39;
            iVar18 = -(uint)(iVar18 < auVar26._0_4_);
            auVar77._4_4_ = -(uint)(iVar36 < auVar26._4_4_);
            iVar79 = -(uint)(iVar79 < auVar26._8_4_);
            auVar77._12_4_ = -(uint)(iVar29 < auVar26._12_4_);
            auVar71._4_4_ = iVar18;
            auVar71._0_4_ = iVar18;
            auVar71._8_4_ = iVar79;
            auVar71._12_4_ = iVar79;
            iVar18 = -(uint)(auVar26._4_4_ == iVar36);
            iVar36 = -(uint)(auVar26._12_4_ == iVar29);
            auVar15._4_4_ = iVar18;
            auVar15._0_4_ = iVar18;
            auVar15._8_4_ = iVar36;
            auVar15._12_4_ = iVar36;
            auVar77._0_4_ = auVar77._4_4_;
            auVar77._8_4_ = auVar77._12_4_;
            auVar26 = auVar15 & auVar71 | auVar77;
            auVar26 = packssdw(auVar26,auVar26);
            auVar26 = packssdw(auVar26 ^ auVar51,auVar26 ^ auVar51);
            if ((auVar26 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(unsigned_short *)((long)pvVar20 + lVar23 + 0xc) = v;
            }
            auVar26 = pshufhw(auVar26,auVar71,0x84);
            auVar16._4_4_ = iVar18;
            auVar16._0_4_ = iVar18;
            auVar16._8_4_ = iVar36;
            auVar16._12_4_ = iVar36;
            auVar37 = pshufhw(auVar71,auVar16,0x84);
            auVar81 = pshufhw(auVar26,auVar77,0x84);
            auVar26 = (auVar81 | auVar37 & auVar26) ^ auVar51;
            in_XMM1 = packssdw(auVar26,auVar26);
            if ((in_XMM1 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(unsigned_short *)((long)pvVar20 + lVar23 + 0xe) = v;
            }
            lVar19 = auVar54._8_8_;
            auVar54._0_8_ = auVar54._0_8_ + 8;
            auVar54._8_8_ = lVar19 + 8;
            lVar19 = auVar56._8_8_;
            auVar56._0_8_ = auVar56._0_8_ + 8;
            auVar56._8_8_ = lVar19 + 8;
            lVar19 = auVar57._8_8_;
            auVar57._0_8_ = auVar57._0_8_ + 8;
            auVar57._8_8_ = lVar19 + 8;
            lVar19 = auVar58._8_8_;
            auVar58._0_8_ = auVar58._0_8_ + 8;
            auVar58._8_8_ = lVar19 + 8;
            lVar23 = lVar23 + 0x10;
          } while ((ulong)(uVar1 + 7 >> 3) << 4 != lVar23);
        }
        pvVar20 = (void *)((long)pvVar20 + lVar24 * 2);
        iVar73 = iVar73 + 1;
      } while (iVar73 != iVar2);
    }
  }
  puVar25 = puVar17;
  if (type == 1) {
    if (top < 1) {
      iVar73 = 0;
    }
    else {
      iVar18 = 0;
      do {
        uVar22 = 0;
        if (0 < left) {
          uVar22 = 0;
          do {
            *(undefined2 *)((long)pvVar20 + uVar22 * 2) = *puVar17;
            uVar22 = uVar22 + 1;
          } while (uVar21 != uVar22);
        }
        uVar3 = src->w;
        if ((int)uVar3 < 0xc) {
          if ((int)uVar22 < (int)(uVar3 + left)) {
            uVar22 = uVar22 & 0xffffffff;
            do {
              *(undefined2 *)((long)pvVar20 + uVar22 * 2) = puVar17[uVar22 - (long)left];
              uVar22 = uVar22 + 1;
            } while (uVar3 + left != uVar22);
          }
        }
        else {
          memcpy((void *)((long)pvVar20 + (long)left * 2),puVar17,(ulong)uVar3 * 2);
          uVar22 = (ulong)(uint)((int)uVar22 + src->w);
        }
        if ((int)uVar22 < (int)uVar1) {
          iVar73 = src->w;
          lVar23 = (long)(int)uVar22;
          do {
            *(undefined2 *)((long)pvVar20 + lVar23 * 2) = puVar17[(long)iVar73 + -1];
            lVar23 = lVar23 + 1;
          } while (lVar24 != lVar23);
        }
        pvVar20 = (void *)((long)pvVar20 + lVar24 * 2);
        iVar18 = iVar18 + 1;
        iVar73 = top;
      } while (iVar18 != top);
    }
    if (iVar73 < src->h + top) {
      do {
        uVar22 = 0;
        if (0 < left) {
          uVar22 = 0;
          do {
            *(undefined2 *)((long)pvVar20 + uVar22 * 2) = *puVar17;
            uVar22 = uVar22 + 1;
          } while ((uint)left != uVar22);
        }
        uVar3 = src->w;
        if ((int)uVar3 < 0xc) {
          if ((int)uVar22 < (int)(uVar3 + left)) {
            uVar22 = uVar22 & 0xffffffff;
            do {
              *(undefined2 *)((long)pvVar20 + uVar22 * 2) = puVar17[uVar22 - (long)left];
              uVar22 = uVar22 + 1;
            } while (uVar3 + left != uVar22);
          }
        }
        else {
          memcpy((void *)((long)pvVar20 + (long)left * 2),puVar17,(ulong)uVar3 * 2);
          uVar22 = (ulong)(uint)((int)uVar22 + src->w);
        }
        if ((int)uVar22 < (int)uVar1) {
          iVar18 = src->w;
          lVar23 = (long)(int)uVar22;
          do {
            *(undefined2 *)((long)pvVar20 + lVar23 * 2) = puVar17[(long)iVar18 + -1];
            lVar23 = lVar23 + 1;
          } while (lVar24 != lVar23);
        }
        puVar17 = puVar17 + src->w;
        pvVar20 = (void *)((long)pvVar20 + lVar24 * 2);
        iVar73 = iVar73 + 1;
      } while (iVar73 < src->h + top);
    }
    iVar18 = src->w;
    puVar25 = puVar17 + -(long)iVar18;
    if (iVar73 < iVar2) {
      do {
        uVar22 = 0;
        if (0 < left) {
          uVar22 = 0;
          do {
            *(undefined2 *)((long)pvVar20 + uVar22 * 2) = *puVar25;
            uVar22 = uVar22 + 1;
          } while (uVar21 != uVar22);
        }
        uVar3 = src->w;
        if ((int)uVar3 < 0xc) {
          if ((int)uVar22 < (int)(uVar3 + left)) {
            uVar22 = uVar22 & 0xffffffff;
            do {
              *(undefined2 *)((long)pvVar20 + uVar22 * 2) =
                   *(undefined2 *)
                    ((long)puVar17 + (uVar22 * 2 - ((long)left * 2 + (long)iVar18 * 2)));
              uVar22 = uVar22 + 1;
            } while (uVar3 + left != uVar22);
          }
        }
        else {
          memcpy((void *)((long)pvVar20 + (long)left * 2),puVar25,(ulong)uVar3 * 2);
          uVar22 = (ulong)(uint)((int)uVar22 + src->w);
        }
        if ((int)uVar22 < (int)uVar1) {
          iVar36 = src->w;
          lVar23 = (long)(int)uVar22;
          do {
            *(undefined2 *)((long)pvVar20 + lVar23 * 2) = puVar25[(long)iVar36 + -1];
            lVar23 = lVar23 + 1;
          } while (lVar24 != lVar23);
        }
        pvVar20 = (void *)((long)pvVar20 + lVar24 * 2);
        iVar73 = iVar73 + 1;
      } while (iVar73 != iVar2);
    }
  }
  if (type == 2) {
    puVar25 = puVar25 + (long)top * (long)src->w;
    lVar23 = (long)left;
    if (top < 1) {
      iVar73 = 0;
    }
    else {
      iVar18 = 0;
      do {
        uVar22 = 0;
        if (0 < left) {
          puVar17 = puVar25 + lVar23;
          uVar22 = 0;
          do {
            *(undefined2 *)((long)pvVar20 + uVar22 * 2) = *puVar17;
            uVar22 = uVar22 + 1;
            puVar17 = puVar17 + -1;
          } while (uVar21 != uVar22);
        }
        uVar3 = src->w;
        if ((int)uVar3 < 0xc) {
          if ((int)uVar22 < (int)(uVar3 + left)) {
            uVar22 = uVar22 & 0xffffffff;
            do {
              *(undefined2 *)((long)pvVar20 + uVar22 * 2) = puVar25[uVar22 - lVar23];
              uVar22 = uVar22 + 1;
            } while (uVar3 + left != uVar22);
          }
        }
        else {
          memcpy((void *)((long)pvVar20 + lVar23 * 2),puVar25,(ulong)uVar3 * 2);
          uVar22 = (ulong)(uint)((int)uVar22 + src->w);
        }
        iVar73 = (int)uVar22;
        if (iVar73 < (int)uVar1) {
          lVar19 = (long)iVar73;
          iVar73 = (left + -2 + src->w * 2) - iVar73;
          do {
            *(undefined2 *)((long)pvVar20 + lVar19 * 2) = puVar25[iVar73];
            lVar19 = lVar19 + 1;
            iVar73 = iVar73 + -1;
          } while (lVar24 != lVar19);
        }
        pvVar20 = (void *)((long)pvVar20 + lVar24 * 2);
        puVar25 = puVar25 + -(long)src->w;
        iVar18 = iVar18 + 1;
        iVar73 = top;
      } while (iVar18 != top);
    }
    if (iVar73 < src->h + top) {
      do {
        uVar22 = 0;
        if (0 < left) {
          puVar17 = puVar25 + lVar23;
          uVar22 = 0;
          do {
            *(undefined2 *)((long)pvVar20 + uVar22 * 2) = *puVar17;
            uVar22 = uVar22 + 1;
            puVar17 = puVar17 + -1;
          } while (uVar21 != uVar22);
        }
        uVar3 = src->w;
        if ((int)uVar3 < 0xc) {
          if ((int)uVar22 < (int)(uVar3 + left)) {
            uVar22 = uVar22 & 0xffffffff;
            do {
              *(undefined2 *)((long)pvVar20 + uVar22 * 2) = puVar25[uVar22 - lVar23];
              uVar22 = uVar22 + 1;
            } while (uVar3 + left != uVar22);
          }
        }
        else {
          memcpy((void *)((long)pvVar20 + lVar23 * 2),puVar25,(ulong)uVar3 * 2);
          uVar22 = (ulong)(uint)((int)uVar22 + src->w);
        }
        iVar18 = (int)uVar22;
        if (iVar18 < (int)uVar1) {
          lVar19 = (long)iVar18;
          iVar18 = (left + -2 + src->w * 2) - iVar18;
          do {
            *(undefined2 *)((long)pvVar20 + lVar19 * 2) = puVar25[iVar18];
            lVar19 = lVar19 + 1;
            iVar18 = iVar18 + -1;
          } while (lVar24 != lVar19);
        }
        puVar25 = puVar25 + src->w;
        pvVar20 = (void *)((long)pvVar20 + lVar24 * 2);
        iVar73 = iVar73 + 1;
      } while (iVar73 < src->h + top);
    }
    if (iVar73 < iVar2) {
      puVar25 = puVar25 + (long)src->w * -2;
      do {
        uVar22 = 0;
        if (0 < left) {
          puVar17 = puVar25 + lVar23;
          uVar22 = 0;
          do {
            *(undefined2 *)((long)pvVar20 + uVar22 * 2) = *puVar17;
            uVar22 = uVar22 + 1;
            puVar17 = puVar17 + -1;
          } while (uVar21 != uVar22);
        }
        uVar3 = src->w;
        if ((int)uVar3 < 0xc) {
          if ((int)uVar22 < (int)(uVar3 + left)) {
            uVar22 = uVar22 & 0xffffffff;
            do {
              *(undefined2 *)((long)pvVar20 + uVar22 * 2) = puVar25[uVar22 - lVar23];
              uVar22 = uVar22 + 1;
            } while (uVar3 + left != uVar22);
          }
        }
        else {
          memcpy((void *)((long)pvVar20 + lVar23 * 2),puVar25,(ulong)uVar3 * 2);
          uVar22 = (ulong)(uint)((int)uVar22 + src->w);
        }
        iVar18 = (int)uVar22;
        if (iVar18 < (int)uVar1) {
          lVar19 = (long)iVar18;
          iVar18 = (left + -2 + src->w * 2) - iVar18;
          do {
            *(undefined2 *)((long)pvVar20 + lVar19 * 2) = puVar25[iVar18];
            lVar19 = lVar19 + 1;
            iVar18 = iVar18 + -1;
          } while (lVar24 != lVar19);
        }
        pvVar20 = (void *)((long)pvVar20 + lVar24 * 2);
        puVar25 = puVar25 + -(long)src->w;
        iVar73 = iVar73 + 1;
      } while (iVar73 != iVar2);
    }
  }
  return;
}

Assistant:

static void copy_make_border_image(const Mat& src, Mat& dst, int top, int left, int type, T v)
{
    int w = dst.w;
    int h = dst.h;

    const T* ptr = src;
    T* outptr = dst;

    if (type == 0)
    {
        int y = 0;
        // fill top
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            outptr += w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = v;
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            outptr += w;
        }
    }

    if (type == 1)
    {
        int y = 0;
        // fill top
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            outptr += w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        ptr -= src.w;
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            outptr += w;
        }
    }

    if (type == 2)
    {
        int y = 0;
        // fill top
        ptr += top * src.w;
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[left - x];
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - (x - left - src.w) - 2];
            }
            outptr += w;
            ptr -= src.w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[left - x];
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - (x - left - src.w) - 2];
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        ptr -= 2 * src.w;
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[left - x];
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - (x - left - src.w) - 2];
            }
            outptr += w;
            ptr -= src.w;
        }
    }
}